

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O0

void __thiscall
adios2::helper::CommImplMPI::Bcast
          (CommImplMPI *this,void *buffer,size_t count,Datatype datatype,int root,string *hint)

{
  MPI_Datatype poVar1;
  long lVar2;
  Datatype in_ECX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  uchar *blockBuf;
  size_t blockSize;
  int MAXBCASTSIZE;
  size_t inputSize;
  string *in_stack_000000e8;
  int in_stack_000000f4;
  ulong local_78;
  ulong local_58;
  long local_48;
  ulong local_40;
  ulong local_30;
  
  local_58 = in_RDX;
  if (0x40000000 < in_RDX) {
    local_58 = 0x40000000;
  }
  local_40 = local_58;
  local_48 = in_RSI;
  local_30 = in_RDX;
  while (local_30 != 0) {
    poVar1 = anon_unknown_1::ToMPI(in_ECX);
    MPI_Bcast(local_48,local_40 & 0xffffffff,poVar1,in_R8D,*(undefined8 *)(in_RDI + 8));
    anon_unknown_1::CheckMPIReturn(in_stack_000000f4,in_stack_000000e8);
    lVar2 = adios2::helper::CommImpl::SizeOf(in_ECX);
    local_48 = local_40 * lVar2 + local_48;
    local_30 = local_30 - local_40;
    local_78 = local_30;
    if (0x40000000 < local_30) {
      local_78 = 0x40000000;
    }
    local_40 = local_78;
  }
  return;
}

Assistant:

void CommImplMPI::Bcast(void *buffer, size_t count, Datatype datatype, int root,
                        const std::string &hint) const
{
    size_t inputSize = count;
    const int MAXBCASTSIZE = 1073741824;
    size_t blockSize = (inputSize > MAXBCASTSIZE ? MAXBCASTSIZE : inputSize);
    unsigned char *blockBuf = static_cast<unsigned char *>(buffer);
    while (inputSize > 0)
    {
        CheckMPIReturn(
            MPI_Bcast(blockBuf, static_cast<int>(blockSize), ToMPI(datatype), root, m_MPIComm),
            hint);
        blockBuf += blockSize * CommImpl::SizeOf(datatype);
        inputSize -= blockSize;
        blockSize = (inputSize > MAXBCASTSIZE ? MAXBCASTSIZE : inputSize);
    }
}